

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O1

AffineSpace3fa *
embree::calculate_interpolated_space
          (AffineSpace3fa *__return_storage_ptr__,ISPCInstanceArray *instanceArray,uint primID,
          float gtime)

{
  Vector *pVVar1;
  uint uVar2;
  AffineSpace3fa *pAVar3;
  AffineSpace3fa *pAVar4;
  AffineSpace3fa *pAVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined8 uVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  
  uVar2 = instanceArray->numTimeSteps;
  if (uVar2 == 1) {
    pAVar3 = *instanceArray->spaces_array;
    uVar36 = *(undefined8 *)((long)&pAVar3[primID].l.vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 =
         *(undefined8 *)&pAVar3[primID].l.vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar36;
    pVVar1 = &pAVar3[primID].l.vy;
    uVar36 = *(undefined8 *)((long)&pVVar1->field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = *(undefined8 *)&pVVar1->field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uVar36;
    pVVar1 = &pAVar3[primID].l.vz;
    uVar36 = *(undefined8 *)((long)&pVVar1->field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = *(undefined8 *)&pVVar1->field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uVar36;
    uVar36 = *(undefined8 *)((long)&pAVar3[primID].p.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->p).field_0 = *(undefined8 *)&pAVar3[primID].p.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->p).field_0 + 8) = uVar36;
  }
  else {
    fVar40 = (float)(int)(uVar2 - 1) * gtime;
    fVar38 = floorf(fVar40);
    uVar6 = uVar2 - 2;
    if ((int)fVar38 < (int)(uVar2 - 2)) {
      uVar6 = (int)fVar38;
    }
    uVar37 = 0;
    if (0 < (int)uVar6) {
      uVar37 = (ulong)uVar6;
    }
    fVar40 = fVar40 - (float)(int)uVar37;
    fVar39 = 1.0 - fVar40;
    pAVar4 = instanceArray->spaces_array[uVar37];
    pAVar5 = instanceArray->spaces_array[uVar37 + 1];
    pAVar3 = pAVar4 + primID;
    fVar38 = (pAVar3->l).vx.field_0.m128[1];
    fVar7 = (pAVar3->l).vx.field_0.m128[2];
    fVar8 = (pAVar3->l).vx.field_0.m128[3];
    pVVar1 = &pAVar4[primID].l.vy;
    fVar9 = (pVVar1->field_0).m128[0];
    fVar10 = (pVVar1->field_0).m128[1];
    fVar11 = (pVVar1->field_0).m128[2];
    fVar12 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar4[primID].l.vz;
    fVar13 = (pVVar1->field_0).m128[0];
    fVar14 = (pVVar1->field_0).m128[1];
    fVar15 = (pVVar1->field_0).m128[2];
    fVar16 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar4[primID].p;
    fVar17 = (pVVar1->field_0).m128[0];
    fVar18 = (pVVar1->field_0).m128[1];
    fVar19 = (pVVar1->field_0).m128[2];
    fVar20 = (pVVar1->field_0).m128[3];
    pAVar4 = pAVar5 + primID;
    fVar21 = (pAVar4->l).vx.field_0.m128[1];
    fVar22 = (pAVar4->l).vx.field_0.m128[2];
    fVar23 = (pAVar4->l).vx.field_0.m128[3];
    pVVar1 = &pAVar5[primID].l.vy;
    fVar24 = (pVVar1->field_0).m128[0];
    fVar25 = (pVVar1->field_0).m128[1];
    fVar26 = (pVVar1->field_0).m128[2];
    fVar27 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[primID].l.vz;
    fVar28 = (pVVar1->field_0).m128[0];
    fVar29 = (pVVar1->field_0).m128[1];
    fVar30 = (pVVar1->field_0).m128[2];
    fVar31 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[primID].p;
    fVar32 = (pVVar1->field_0).m128[0];
    fVar33 = (pVVar1->field_0).m128[1];
    fVar34 = (pVVar1->field_0).m128[2];
    fVar35 = (pVVar1->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         (pAVar4->l).vx.field_0.m128[0] * fVar40 + (pAVar3->l).vx.field_0.m128[0] * fVar39;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar21 * fVar40 + fVar38 * fVar39;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar22 * fVar40 + fVar7 * fVar39;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar23 * fVar40 + fVar8 * fVar39;
    (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar24 * fVar40 + fVar9 * fVar39;
    (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar25 * fVar40 + fVar10 * fVar39;
    (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar26 * fVar40 + fVar11 * fVar39;
    (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar27 * fVar40 + fVar12 * fVar39;
    (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar28 * fVar40 + fVar13 * fVar39;
    (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar29 * fVar40 + fVar14 * fVar39;
    (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar30 * fVar40 + fVar15 * fVar39;
    (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar31 * fVar40 + fVar16 * fVar39;
    (__return_storage_ptr__->p).field_0.m128[0] = fVar40 * fVar32 + fVar39 * fVar17;
    (__return_storage_ptr__->p).field_0.m128[1] = fVar40 * fVar33 + fVar39 * fVar18;
    (__return_storage_ptr__->p).field_0.m128[2] = fVar40 * fVar34 + fVar39 * fVar19;
    (__return_storage_ptr__->p).field_0.m128[3] = fVar40 * fVar35 + fVar39 * fVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa calculate_interpolated_space (ISPCInstanceArray* instanceArray, unsigned int primID, float gtime)
{
  if (instanceArray->numTimeSteps == 1)
    return AffineSpace3fa(instanceArray->spaces_array[0][primID]);

   /* calculate time segment itime and fractional time ftime */
  const int time_segments = instanceArray->numTimeSteps-1;
  const float time = gtime*(float)(time_segments);
  const int itime = clamp((int)(floor(time)),(int)0,time_segments-1);
  const float ftime = time - (float)(itime);
  return (1.0f-ftime)*AffineSpace3fa(instanceArray->spaces_array[itime+0][primID]) + ftime*AffineSpace3fa(instanceArray->spaces_array[itime+1][primID]);
}